

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O3

string * GetAutogenTargetBuildDir_abi_cxx11_
                   (string *__return_storage_ptr__,cmGeneratorTarget *target)

{
  char *pcVar1;
  string *psVar2;
  char *__s;
  string *extraout_RAX;
  string local_40;
  
  psVar2 = GetSafeProperty_abi_cxx11_(__return_storage_ptr__,target,"AUTOGEN_BUILD_DIR");
  if (__return_storage_ptr__->_M_string_length == 0) {
    __s = cmMakefile::GetCurrentBinaryDirectory(target->Target->Makefile);
    pcVar1 = (char *)__return_storage_ptr__->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar1,(ulong)__s);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    GetAutogenTargetName_abi_cxx11_(&local_40,target);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_40._M_dataplus._M_p)
    ;
    psVar2 = (string *)&local_40.field_2;
    if ((string *)local_40._M_dataplus._M_p != psVar2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      psVar2 = extraout_RAX;
    }
  }
  return psVar2;
}

Assistant:

static std::string GetAutogenTargetBuildDir(cmGeneratorTarget const* target)
{
  std::string targetDir = GetSafeProperty(target, "AUTOGEN_BUILD_DIR");
  if (targetDir.empty()) {
    cmMakefile* makefile = target->Target->GetMakefile();
    targetDir = makefile->GetCurrentBinaryDirectory();
    targetDir += "/";
    targetDir += GetAutogenTargetName(target);
  }
  return targetDir;
}